

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary_unittest.cc
# Opt level: O1

void anon_unknown.dwarf_4ac5::Test_TemplateDictionary_SetFormattedValue::Run(void)

{
  bool bVar1;
  char *pcVar2;
  long *plVar3;
  ulong *puVar4;
  bool *pbVar5;
  TemplateDictionary *this;
  ulong uVar6;
  undefined8 in_R9;
  int iVar7;
  TemplateString *pTVar8;
  string expected;
  TemplateDictionaryPeer peer;
  string dump;
  string dump2;
  TemplateDictionary dict;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  TemplateString local_1c8;
  TemplateDictionaryPeer local_1a8;
  undefined1 local_1a0 [24];
  TemplateId TStack_188;
  ulong *local_180;
  long local_178;
  ulong local_170;
  undefined4 uStack_168;
  undefined4 uStack_164;
  ulong *local_160;
  long local_158;
  ulong local_150 [2];
  TemplateString local_140;
  TemplateString local_120;
  char *local_100;
  undefined8 uStack_f8;
  undefined1 local_f0;
  undefined3 uStack_ef;
  undefined8 uStack_e8;
  char *local_e0;
  undefined8 uStack_d8;
  undefined4 local_d0;
  undefined8 uStack_c8;
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  TemplateDictionary local_a0 [112];
  
  local_140.ptr_ = "test_SetFormattedValue";
  local_140.length_ = 0x16;
  local_140.is_immutable_ = true;
  local_140.id_ = 0;
  this = local_a0;
  ctemplate::TemplateDictionary::TemplateDictionary(this,&local_140,(UnsafeArena *)0x0);
  local_e0 = "PRINTF";
  uStack_d8 = 6;
  local_d0 = CONCAT31(local_d0._1_3_,1);
  uStack_c8 = 0;
  local_e0._0_4_ = 0x115500;
  uStack_d8._0_4_ = 6;
  uStack_c8._0_4_ = 0;
  uVar9 = local_e0._0_4_;
  uVar10 = (undefined4)uStack_d8;
  uVar11 = local_d0;
  uVar12 = (undefined4)uStack_c8;
  local_1a8.dict_ = this;
  ctemplate::TemplateDictionary::SetFormattedValue(this,"%s test %04d","template test",1);
  local_140.ptr_ = "PRINTF";
  local_140.length_ = 6;
  local_140.is_immutable_ = true;
  local_140.id_ = 0;
  local_1c8.ptr_ = "template test test 0001";
  local_1c8.length_ = 0x17;
  local_1c8.is_immutable_ = true;
  local_1c8.id_ = 0;
  bVar1 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_1a8,&local_140,&local_1c8);
  if (bVar1) {
    local_140.length_ = 0;
    local_140.is_immutable_ = false;
    local_140.ptr_ = &local_140.is_immutable_;
    ctemplate::TemplateDictionary::DumpToString((string *)local_a0,(int)&local_140);
    this = (TemplateDictionary *)local_140.ptr_;
    pcVar2 = strstr(local_140.ptr_,"\n   PRINTF: >template test test 0001<\n");
    if (pcVar2 != (char *)0x0) {
      local_100 = "PRINTF";
      uStack_f8 = 6;
      _local_f0 = CONCAT31(uStack_ef,1);
      uStack_e8 = 0;
      ctemplate::TemplateDictionary::SetFormattedValue(local_a0,"%s test %04444d","template test",2)
      ;
      local_1c8.ptr_ = &local_1c8.is_immutable_;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"template test test ","")
      ;
      iVar7 = 0x115b;
      pbVar5 = (bool *)0x117849;
      pTVar8 = &local_1c8;
      do {
        std::__cxx11::string::append((char *)pTVar8);
        iVar7 = iVar7 + -1;
      } while (iVar7 != 0);
      std::__cxx11::string::append((char *)&local_1c8);
      local_120.ptr_ = "PRINTF";
      local_120.length_ = 6;
      local_120.is_immutable_ = true;
      local_120.id_ = 0;
      local_1a0._0_8_ = local_1c8.ptr_;
      local_1a0._8_8_ = local_1c8.length_;
      local_1a0._16_8_ = local_1a0._16_8_ & 0xffffffffffffff00;
      TStack_188 = 0;
      bVar1 = ctemplate::TemplateDictionaryPeer::ValueIs
                        (&local_1a8,&local_120,(TemplateString *)local_1a0);
      if (bVar1) {
        local_120.length_ = 0;
        local_120.is_immutable_ = false;
        local_120.ptr_ = &local_120.is_immutable_;
        ctemplate::TemplateDictionary::DumpToString((string *)local_a0,(int)&local_120);
        local_c0[0] = local_b0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"\n   PRINTF: >","");
        plVar3 = (long *)std::__cxx11::string::_M_append((char *)local_c0,(ulong)local_1c8.ptr_);
        puVar4 = (ulong *)(plVar3 + 2);
        if ((ulong *)*plVar3 == puVar4) {
          local_170 = *puVar4;
          uStack_168 = (undefined4)plVar3[3];
          uStack_164 = *(undefined4 *)((long)plVar3 + 0x1c);
          local_180 = &local_170;
        }
        else {
          local_170 = *puVar4;
          local_180 = (ulong *)*plVar3;
        }
        local_178 = plVar3[1];
        *plVar3 = (long)puVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        local_160 = local_150;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"<\n","");
        uVar6 = 0xf;
        if (local_180 != &local_170) {
          uVar6 = local_170;
        }
        if (uVar6 < (ulong)(local_158 + local_178)) {
          uVar6 = 0xf;
          if (local_160 != local_150) {
            uVar6 = local_150[0];
          }
          if (uVar6 < (ulong)(local_158 + local_178)) goto LAB_0010b5b2;
          plVar3 = (long *)std::__cxx11::string::replace
                                     ((ulong)&local_160,0,(char *)0x0,(ulong)local_180);
        }
        else {
LAB_0010b5b2:
          plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_180,(ulong)local_160);
        }
        local_1a0._0_8_ = &((TemplateString *)local_1a0)->is_immutable_;
        pTVar8 = (TemplateString *)(plVar3 + 2);
        if ((TemplateString *)*plVar3 == pTVar8) {
          local_1a0._16_8_ = pTVar8->ptr_;
          TStack_188 = plVar3[3];
        }
        else {
          local_1a0._16_8_ = pTVar8->ptr_;
          local_1a0._0_8_ = (TemplateString *)*plVar3;
        }
        local_1a0._8_8_ = plVar3[1];
        *plVar3 = (long)pTVar8;
        plVar3[1] = 0;
        *(undefined1 *)&pTVar8->ptr_ = 0;
        std::__cxx11::string::operator=((string *)&local_1c8,(string *)local_1a0);
        if ((bool *)local_1a0._0_8_ != &((TemplateString *)local_1a0)->is_immutable_) {
          operator_delete((void *)local_1a0._0_8_);
        }
        if (local_160 != local_150) {
          operator_delete(local_160);
        }
        if (local_180 != &local_170) {
          operator_delete(local_180);
        }
        if (local_c0[0] != local_b0) {
          operator_delete(local_c0[0]);
        }
        pbVar5 = (bool *)local_120.ptr_;
        pTVar8 = (TemplateString *)local_1c8.ptr_;
        pcVar2 = strstr(local_120.ptr_,local_1c8.ptr_);
        if (pcVar2 != (char *)0x0) {
          if (pbVar5 != &local_120.is_immutable_) {
            operator_delete(pbVar5);
          }
          if ((bool *)local_1c8.ptr_ != &local_1c8.is_immutable_) {
            operator_delete(local_1c8.ptr_);
          }
          if ((bool *)local_140.ptr_ != &local_140.is_immutable_) {
            operator_delete(local_140.ptr_);
          }
          ctemplate::TemplateDictionary::~TemplateDictionary(local_a0);
          return;
        }
      }
      else {
        _GLOBAL__N_1::Test_TemplateDictionary_SetFormattedValue::Run();
      }
      printf("%s: %d: ASSERT FAILED: \'%s\' not in \'%s\'\n",
             "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_dictionary_unittest.cc"
             ,0xe6,pTVar8,pbVar5);
      pcVar2 = strstr(local_120.ptr_,local_1c8.ptr_);
      if (pcVar2 == (char *)0x0) {
        __assert_fail("strstr((dump2.c_str()), (expected.c_str()))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_dictionary_unittest.cc"
                      ,0xe6,
                      "static void (anonymous namespace)::Test_TemplateDictionary_SetFormattedValue::Run()"
                     );
      }
      goto LAB_0010b7a3;
    }
  }
  else {
    _GLOBAL__N_1::Test_TemplateDictionary_SetFormattedValue::Run();
  }
  printf("%s: %d: ASSERT FAILED: \'%s\' not in \'%s\'\n",
         "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_dictionary_unittest.cc"
         ,0xd9,"\n   PRINTF: >template test test 0001<\n",this,in_R9,uVar9,uVar10,uVar11,uVar12);
  pcVar2 = strstr(local_140.ptr_,"\n   PRINTF: >template test test 0001<\n");
  if (pcVar2 == (char *)0x0) {
    __assert_fail("strstr((dump.c_str()), (\"\\n   PRINTF: >template test test 0001<\\n\"))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_dictionary_unittest.cc"
                  ,0xd9,
                  "static void (anonymous namespace)::Test_TemplateDictionary_SetFormattedValue::Run()"
                 );
  }
LAB_0010b7a3:
  exit(1);
}

Assistant:

TEST(TemplateDictionary, SetValueWithoutCopy) {
  UnsafeArena arena(100);
  TemplateDictionary dict("Test arena", &arena);

  char value[32];
  snprintf(value, sizeof(value), "%s", "value");

  const void* const ptr = arena.Alloc(0);
  dict.SetValueWithoutCopy("key", value);
  // We shouldn't have copied the value string.
  EXPECT_EQ(ptr, arena.Alloc(0));

  TemplateDictionaryPeer peer(&dict);
  EXPECT_TRUE(peer.ValueIs("key", "value"));
  // If our content changes, so does what's in the dictionary -- but
  // only the contents of the buffer, not its length!
  snprintf(value, sizeof(value), "%s", "not_value");
  EXPECT_TRUE(peer.ValueIs("key", "not_v"));   // sizeof("not_v") == sizeof("value")
}